

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_FailSet_Test::~TApp_FailSet_Test(TApp_FailSet_Test *this)

{
  TApp_FailSet_Test *this_local;
  
  ~TApp_FailSet_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, FailSet) {

    int choice;
    app.add_set("-q,--quick", choice, {1, 2, 3});

    args = {"--quick", "3", "--quick=2"};
    EXPECT_THROW(run(), CLI::ArgumentMismatch);

    app.reset();

    args = {"--quick=hello"};
    EXPECT_THROW(run(), CLI::ConversionError);
}